

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O2

void lowbd_fwd_txfm2d_64x32_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  transform_1d_sse2 p_Var2;
  int8_t *piVar3;
  undefined7 in_register_00000009;
  __m128i *out;
  int i_1;
  long lVar4;
  int val;
  int i;
  long lVar5;
  __m128i *palVar6;
  int bit;
  undefined1 auVar7 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  __m128i bufB [64];
  __m128i bufA [64];
  __m128i buf0 [64];
  __m128i buf1 [256];
  
  piVar3 = av1_fwd_txfm_shift_ls[0xc];
  p_Var2 = col_txfm8x32_arr[CONCAT71(in_register_00000009,tx_type) & 0xffffffff];
  palVar6 = buf1;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    load_buffer_16bit_to_16bit(input + lVar5 * 8,stride,buf0,0x20);
    round_shift_16bit(buf0,0x20,(int)*piVar3);
    (*p_Var2)(buf0,buf0,'\f');
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    round_shift_16bit(buf0,0x20,(int)piVar3[1]);
    out = palVar6;
    for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 0x80) {
      transpose_16bit_8x8((__m128i *)((long)buf0[0] + lVar4),out);
      out = out + 0x40;
    }
    palVar6 = palVar6 + 8;
  }
  palVar6 = buf1;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 0x10) {
      auVar7 = *(undefined1 (*) [16])((long)*palVar6 + lVar4);
      in_XMM1 = pmovsxwd(in_XMM1,auVar7);
      *(undefined1 (*) [16])((long)bufA[0] + lVar4) = in_XMM1;
      auVar7._0_8_ = auVar7._8_8_;
      auVar7 = pmovsxwd(auVar7,auVar7);
      *(undefined1 (*) [16])((long)bufB[0] + lVar4) = auVar7;
    }
    bit = 1;
    av1_fdct64_sse4_1(bufA,bufA,'\v',1,1);
    val = bit;
    av1_fdct64_sse4_1(bufB,bufB,'\v',1,1);
    cVar1 = piVar3[2];
    av1_round_shift_rect_array_32_sse4_1(bufA,bufA,-(int)cVar1,bit,val);
    av1_round_shift_rect_array_32_sse4_1(bufB,bufB,-(int)cVar1,bit,val);
    store_output_32bit_w8(output + lVar5 * 8,bufA,bufB,bit,val);
    palVar6 = palVar6 + 0x40;
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x32_sse4_1(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_64X32;
  __m128i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = col_txfm8x32_arr[tx_type];
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div8); ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }
  assert(tx_type == DCT_DCT);
  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i bufA[64];
    __m128i bufB[64];
    __m128i *buf = buf1 + width * i;
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm_cvtepi16_epi32(buf[j]);
      bufB[j] = _mm_cvtepi16_epi32(_mm_unpackhi_epi64(buf[j], buf[j]));
    }
    av1_fdct64_sse4_1(bufA, bufA, cos_bit_row, 1, 1);
    av1_fdct64_sse4_1(bufB, bufB, cos_bit_row, 1, 1);
    av1_round_shift_rect_array_32_sse4_1(bufA, bufA, 32, -shift[2], NewSqrt2);
    av1_round_shift_rect_array_32_sse4_1(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w8(output + i * 8, bufA, bufB, 32, 32);
  }
}